

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NetAliasSyntax *pNVar1;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_00000110;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_00000110,in_stack_00000108);
  parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NetAliasSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)__fn,
                      (Token *)__child_stack);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NetAliasSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NetAliasSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone(node.nets, alloc),
        node.semi.deepClone(alloc)
    );
}